

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicSSOCase2::Run(BasicSSOCase2 *this)

{
  CallLogWrapper *this_00;
  int width;
  RenderTarget *pRVar1;
  bool bVar2;
  GLuint GVar3;
  GLint res;
  char *glsl_c;
  char *glsl_b;
  char *glsl_a;
  int local_7c;
  string local_78;
  char *local_58;
  char *local_50;
  char *local_48;
  vec3 local_3c;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,&local_7c);
  if (local_7c < 1) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0","");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_48 = 
    "#version 310 es\nlayout(binding = 1, std430) buffer Input {\n  mediump vec2 g_input[4];\n};\nflat out mediump vec3 color;\nvoid main() {\n  gl_Position = vec4(g_input[gl_VertexID], 0.0, 1.0);\n  color = vec3(0.0, 1.0, 0.0);\n}"
    ;
    local_50 = 
    "#version 310 es\nflat in mediump vec3 color;\nlayout(location = 0) out mediump vec4 g_color;\nvoid main() {\n  g_color = vec4(color, 1.0);\n}"
    ;
    local_58 = 
    "#version 310 es\nlayout(local_size_x = 4) in;\nlayout(binding = 1, std430) buffer Output {\n  vec2 g_output[gl_WorkGroupSize.x];\n};\nvoid main() {\n  if (gl_GlobalInvocationID.x == 0u) {\n    g_output[0] = vec2(-0.8, -0.8);\n  } else if (gl_GlobalInvocationID.x == 1u) {\n    g_output[1] = vec2(0.8, -0.8);\n  } else if (gl_GlobalInvocationID.x == 2u) {\n    g_output[2] = vec2(-0.8, 0.8);\n  } else if (gl_GlobalInvocationID.x == 3u) {\n    g_output[3] = vec2(0.8, 0.8);\n  }\n}"
    ;
    GVar3 = glu::CallLogWrapper::glCreateProgram(this_00);
    this->m_program_ab = GVar3;
    GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,this->m_program_ab,GVar3);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
    glu::CallLogWrapper::glShaderSource(this_00,GVar3,1,&local_48,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar3);
    GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glAttachShader(this_00,this->m_program_ab,GVar3);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
    glu::CallLogWrapper::glShaderSource(this_00,GVar3,1,&local_50,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar3);
    glu::CallLogWrapper::glProgramParameteri(this_00,this->m_program_ab,0x8258,1);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program_ab);
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x91b9,1,&local_58);
    this->m_program_c = GVar3;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vao);
    glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,0xffffffff,this->m_program_ab);
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,0x20,this->m_program_c);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x30,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    pRVar1 = (this->super_ComputeShaderBase).renderTarget;
    width = pRVar1->m_width;
    if (width < 500) {
      local_3c.m_data[0] = 0.0;
      local_3c.m_data[1] = 1.0;
      local_3c.m_data[2] = 0.0;
      bVar2 = ComputeShaderBase::ValidateReadBufferCenteredQuad
                        (&this->super_ComputeShaderBase,width,pRVar1->m_height,&local_3c);
      if (!bVar2) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_a =
			"#version 310 es" NL "layout(binding = 1, std430) buffer Input {" NL "  mediump vec2 g_input[4];" NL "};" NL
			"flat out mediump vec3 color;" NL "void main() {" NL
			"  gl_Position = vec4(g_input[gl_VertexID], 0.0, 1.0);" NL "  color = vec3(0.0, 1.0, 0.0);" NL "}";
		const char* const glsl_b =
			"#version 310 es" NL "flat in mediump vec3 color;" NL "layout(location = 0) out mediump vec4 g_color;" NL
			"void main() {" NL "  g_color = vec4(color, 1.0);" NL "}";
		const char* const glsl_c =
			"#version 310 es" NL "layout(local_size_x = 4) in;" NL "layout(binding = 1, std430) buffer Output {" NL
			"  vec2 g_output[gl_WorkGroupSize.x];" NL "};" NL "void main() {" NL
			"  if (gl_GlobalInvocationID.x == 0u) {" NL "    g_output[0] = vec2(-0.8, -0.8);" NL
			"  } else if (gl_GlobalInvocationID.x == 1u) {" NL "    g_output[1] = vec2(0.8, -0.8);" NL
			"  } else if (gl_GlobalInvocationID.x == 2u) {" NL "    g_output[2] = vec2(-0.8, 0.8);" NL
			"  } else if (gl_GlobalInvocationID.x == 3u) {" NL "    g_output[3] = vec2(0.8, 0.8);" NL "  }" NL "}";

		m_program_ab = glCreateProgram();
		GLuint sh	= glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(m_program_ab, sh);
		glDeleteShader(sh);
		glShaderSource(sh, 1, &glsl_a, NULL);
		glCompileShader(sh);

		sh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(m_program_ab, sh);
		glDeleteShader(sh);
		glShaderSource(sh, 1, &glsl_b, NULL);
		glCompileShader(sh);

		glProgramParameteri(m_program_ab, GL_PROGRAM_SEPARABLE, GL_TRUE);
		glLinkProgram(m_program_ab);

		m_program_c = glCreateShaderProgramv(GL_COMPUTE_SHADER, 1, &glsl_c);

		glGenVertexArrays(1, &m_vao);
		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_ALL_SHADER_BITS, m_program_ab);
		glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_program_c);

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec2) * 4, NULL, GL_STREAM_DRAW);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindProgramPipeline(m_pipeline);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (getWindowWidth() < 500 &&
			!ValidateReadBufferCenteredQuad(getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}